

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

void __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Prefix(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,Type type)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar2;
  long lVar3;
  char cVar4;
  
  pcVar1 = (this->level_stack_).stackTop_;
  if (pcVar1 == (this->level_stack_).stack_) {
    this->hasRoot_ = true;
  }
  else {
    if (*(ulong *)(pcVar1 + -0x10) != 0) {
      this_00 = &this->os_->stack_;
      if (pcVar1[-8] == '\x01') {
        lVar3 = (long)this_00->stackEnd_ - (long)this_00->stackTop_;
        cVar4 = ',';
      }
      else {
        cVar4 = ':';
        if ((*(ulong *)(pcVar1 + -0x10) & 1) == 0) {
          cVar4 = ',';
        }
        lVar3 = (long)this_00->stackEnd_ - (long)this_00->stackTop_;
      }
      if (lVar3 < 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,1);
      }
      pcVar2 = this_00->stackTop_;
      this_00->stackTop_ = pcVar2 + 1;
      *pcVar2 = cVar4;
    }
    *(long *)(pcVar1 + -0x10) = *(long *)(pcVar1 + -0x10) + 1;
  }
  return;
}

Assistant:

bool Null()                 { Prefix(kNullType);   return EndValue(WriteNull()); }